

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * getfuncname(lua_State *L,CallInfo *ci,char **name)

{
  char **name_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  if (ci == (CallInfo *)0x0) {
    L_local = (lua_State *)0x0;
  }
  else if ((ci->callstatus & 0x100) == 0) {
    if (((ci->callstatus & 0x20) == 0) && ((ci->previous->callstatus & 2) != 0)) {
      L_local = (lua_State *)funcnamefromcode(L,ci->previous,name);
    }
    else {
      L_local = (lua_State *)0x0;
    }
  }
  else {
    *name = "__gc";
    L_local = (lua_State *)anon_var_dwarf_470f;
  }
  return (char *)L_local;
}

Assistant:

static const char *getfuncname(lua_State *L, CallInfo *ci, const char **name) {
    if (ci == NULL)  /* no 'ci'? */
        return NULL;  /* no info */
    else if (ci->callstatus & CIST_FIN) {  /* is this a finalizer? */
        *name = "__gc";
        return "metamethod";  /* report it as such */
    }
        /* calling function is a known Lua function? */
    else if (!(ci->callstatus & CIST_TAIL) && isLua(ci->previous))
        return funcnamefromcode(L, ci->previous, name);
    else return NULL;  /* no way to find a name */
}